

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O3

Vec_Int_t * Acec_MultDetectInputs(Gia_Man_t *p,Vec_Wec_t *vLeafLits,Vec_Wec_t *vRootLits)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *vSupp;
  Vec_Wrd_t *vTemp;
  word *__s;
  void *__s_00;
  Vec_Int_t *pVVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  size_t __size;
  word Truth;
  void *local_78;
  word **local_68;
  word local_38;
  
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar7 = (int *)malloc(400);
  vSupp->pArray = piVar7;
  iVar5 = p->nObjs;
  lVar14 = (long)iVar5;
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar4 = iVar5;
  }
  vTemp->nCap = iVar4;
  if (iVar4 == 0) {
    vTemp->pArray = (word *)0x0;
    vTemp->nSize = iVar5;
    memset((void *)0x0,0,lVar14 * 8);
    piVar7 = (int *)malloc(0x10);
    *piVar7 = 0;
    local_78 = (void *)0x0;
    piVar7[2] = 0;
    piVar7[3] = 0;
    piVar7[1] = iVar5;
  }
  else {
    __s = (word *)malloc((long)iVar4 * 8);
    vTemp->pArray = __s;
    vTemp->nSize = iVar5;
    memset(__s,0,lVar14 * 8);
    __size = (long)iVar4 << 2;
    local_78 = malloc(__size);
    if (local_78 != (void *)0x0) {
      memset(local_78,0,lVar14 * 4);
    }
    piVar7 = (int *)malloc(0x10);
    *piVar7 = iVar4;
    __s_00 = malloc(__size);
    *(void **)(piVar7 + 2) = __s_00;
    piVar7[1] = iVar5;
    if (__s_00 != (void *)0x0) {
      memset(__s_00,0,lVar14 * 4);
    }
  }
  local_68 = &vTemp->pArray;
  piVar12 = piVar7 + 1;
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      iVar4 = pVVar8->pArray[lVar9];
      lVar11 = (long)iVar4;
      if ((lVar11 < 0) || (p->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar4 == 0) break;
      printf("%d=%d ",lVar11,(ulong)(uint)p->pRefs[lVar11]);
      lVar9 = lVar9 + 1;
      pVVar8 = p->vCis;
    } while (lVar9 < pVVar8->nSize);
  }
  putchar(10);
  iVar4 = p->nObjs;
  if (0 < iVar4) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      uVar2 = *(uint *)(&p->pObjs->field_0x0 + lVar9);
      if (((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) && (3 < p->pRefs[uVar10])) {
        printf("%d=%d ",uVar10 & 0xffffffff);
        iVar4 = p->nObjs;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0xc;
    } while ((long)uVar10 < (long)iVar4);
  }
  putchar(10);
  iVar4 = vLeafLits->nSize;
  if (0 < iVar4) {
    uVar10 = 0;
    do {
      pVVar8 = vLeafLits->pArray;
      if (0 < pVVar8[uVar10].nSize) {
        uVar13 = 0;
        do {
          uVar2 = pVVar8[uVar10].pArray[uVar13];
          local_38 = Gia_ObjComputeTruth6Cis(p,uVar2,vSupp,vTemp);
          if (-1 < vSupp->nSize) {
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            printf("Leaf = %4d : ",(ulong)(uVar2 >> 1));
            printf("Rank = %2d  ",uVar10 & 0xffffffff);
            printf("Supp = %2d  ",(ulong)(uint)vSupp->nSize);
            Extra_PrintHex(_stdout,(uint *)&local_38,vSupp->nSize);
            iVar4 = vSupp->nSize;
            if (iVar4 == 4) {
              printf("    ");
              iVar4 = vSupp->nSize;
            }
            if (iVar4 == 3) {
              printf("      ");
              iVar4 = vSupp->nSize;
            }
            if (iVar4 < 3) {
              printf("       ");
            }
            printf("  ");
            printf("Vector has %d entries: {",(ulong)(uint)vSupp->nSize);
            if (0 < vSupp->nSize) {
              lVar9 = 0;
              do {
                printf(" %d",(ulong)(uint)vSupp->pArray[lVar9]);
                lVar9 = lVar9 + 1;
              } while (lVar9 < vSupp->nSize);
            }
            puts(" }");
            if (0 < vSupp->nSize) {
              piVar3 = vSupp->pArray;
              lVar9 = 0;
              do {
                iVar4 = piVar3[lVar9];
                lVar11 = (long)iVar4;
                if (((lVar11 < 0) || (iVar5 <= iVar4)) ||
                   (piVar1 = (int *)((long)local_78 + lVar11 * 4), *piVar1 = *piVar1 + (int)uVar10,
                   *piVar12 <= iVar4)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                piVar1 = (int *)(*(long *)(piVar7 + 2) + lVar11 * 4);
                *piVar1 = *piVar1 + 1;
                lVar9 = lVar9 + 1;
              } while (lVar9 < vSupp->nSize);
            }
          }
          if (uVar13 == pVVar8[uVar10].nSize - 1) {
            putchar(10);
          }
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)pVVar8[uVar10].nSize);
        iVar4 = vLeafLits->nSize;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)iVar4);
  }
  iVar5 = *piVar12;
  if (0 < iVar5) {
    uVar10 = 0;
    do {
      iVar4 = *(int *)(*(long *)(piVar7 + 2) + uVar10 * 4);
      if (iVar4 != 0) {
        if (lVar14 <= (long)uVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        printf("%d=%d(%.2f) ",(double)*(int *)((long)local_78 + uVar10 * 4) / (double)iVar4,
               uVar10 & 0xffffffff);
        iVar5 = *piVar12;
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)iVar5);
  }
  putchar(10);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
  }
  free(vSupp);
  if (*local_68 != (word *)0x0) {
    free(*local_68);
  }
  free(vTemp);
  if (local_78 != (void *)0x0) {
    free(local_78);
  }
  if (*(void **)(piVar7 + 2) != (void *)0x0) {
    free(*(void **)(piVar7 + 2));
  }
  free(piVar7);
  return pVVar6;
}

Assistant:

Vec_Int_t * Acec_MultDetectInputs( Gia_Man_t * p, Vec_Wec_t * vLeafLits, Vec_Wec_t * vRootLits )
{
    Vec_Int_t * vInputs = Vec_IntAlloc( 100 );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vRanks  = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vCounts = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, iLit, iObj, j, Entry;

    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    Gia_ManForEachCiId( p, iObj, i )
        printf( "%d=%d ", iObj, Gia_ObjRefNumId(p, iObj) );
    printf( "\n" );
    Gia_ManForEachAndId( p, iObj )
        if ( Gia_ObjRefNumId(p, iObj) >= 4 )
            printf( "%d=%d ", iObj, Gia_ObjRefNumId(p, iObj) );
    printf( "\n" );

    Vec_WecForEachLevel( vLeafLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            word Truth = Gia_ObjComputeTruth6Cis( p, iLit, vSupp, vTemp );
            if ( Vec_IntSize(vSupp) >= 0 )
            {
                printf( "Leaf = %4d : ", Abc_Lit2Var(iLit) );
                printf( "Rank = %2d  ", i );
                printf( "Supp = %2d  ", Vec_IntSize(vSupp) );
                Extra_PrintHex( stdout, (unsigned*)&Truth, Vec_IntSize(vSupp) );
                if ( Vec_IntSize(vSupp) == 4 ) printf( "    " );
                if ( Vec_IntSize(vSupp) == 3 ) printf( "      " );
                if ( Vec_IntSize(vSupp) <= 2 ) printf( "       " );
                printf( "  " );
                Vec_IntPrint( vSupp );
                /*
                if ( Truth == 0xF335ACC0F335ACC0 )
                {
                    int iObj = Abc_Lit2Var(iLit);
                    Gia_Man_t * pGia0 = Gia_ManDupAndCones( p, &iObj, 1, 1 );
                    Gia_ManShow( pGia0, NULL, 0, 0, 0 );
                    Gia_ManStop( pGia0 );
                }
                */
            }
            // support rank counts
            Vec_IntForEachEntry( vSupp, Entry, j )
            {
                Vec_IntAddToEntry( vRanks, Entry, i );
                Vec_IntAddToEntry( vCounts, Entry, 1 );
            }
            if ( k == Vec_IntSize(vLevel)-1 )
                printf( "\n" );
        }

    Vec_IntForEachEntry( vCounts, Entry, j )
        if ( Entry )
            printf( "%d=%d(%.2f) ", j, Entry, 1.0*Vec_IntEntry(vRanks, j)/Entry );
    printf( "\n" );

    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    Vec_IntFree( vRanks );
    Vec_IntFree( vCounts );
    return vInputs;
}